

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cc
# Opt level: O2

void __thiscall gimage::View::View(View *this,View *v)

{
  int iVar1;
  undefined4 extraout_var;
  
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image(&this->image,&v->image);
  Image<float,_gimage::PixelTraits<float>_>::Image(&this->depth,&v->depth);
  iVar1 = (*v->camera->_vptr_Camera[2])();
  this->camera = (Camera *)CONCAT44(extraout_var,iVar1);
  return;
}

Assistant:

View::View(const View &v) : image(v.image), depth(v.depth)
{
  camera=v.getCamera()->clone();
}